

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImDrawList::AddQuad(ImDrawList *this,ImVec2 *p1,ImVec2 *p2,ImVec2 *p3,ImVec2 *p4,ImU32 col,
                   float thickness)

{
  ImVector<ImVec2> *this_00;
  
  if (col < 0x1000000) {
    return;
  }
  this_00 = &this->_Path;
  ImVector<ImVec2>::push_back(this_00,p1);
  ImVector<ImVec2>::push_back(this_00,p2);
  ImVector<ImVec2>::push_back(this_00,p3);
  ImVector<ImVec2>::push_back(this_00,p4);
  PathStroke(this,col,true,thickness);
  return;
}

Assistant:

void ImDrawList::AddQuad(const ImVec2& p1, const ImVec2& p2, const ImVec2& p3, const ImVec2& p4, ImU32 col, float thickness)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;

    PathLineTo(p1);
    PathLineTo(p2);
    PathLineTo(p3);
    PathLineTo(p4);
    PathStroke(col, true, thickness);
}